

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void renameTableTest(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  sqlite3 *db;
  u64 uVar1;
  sqlite3_xauth p_Var2;
  int iVar3;
  int iVar4;
  uchar *zDb;
  uchar *puVar5;
  i64 iVar6;
  uint uVar7;
  Parse sParse;
  NameContext local_68;
  
  db = context->pOut->db;
  zDb = sqlite3_value_text(*argv);
  puVar5 = sqlite3_value_text(argv[1]);
  iVar6 = sqlite3VdbeIntValue(argv[4]);
  uVar1 = db->flags;
  p_Var2 = db->xAuth;
  db->xAuth = (sqlite3_xauth)0x0;
  if (puVar5 == (uchar *)0x0 || zDb == (uchar *)0x0) goto LAB_0016d1f3;
  iVar3 = renameParseSql(&sParse,(char *)zDb,1,db,(char *)puVar5,(int)iVar6);
  if (iVar3 == 0) {
    uVar7 = (uint)uVar1;
    if ((sParse.pNewTable == (Table *)0x0 || (uVar7 >> 0x1a & 1) != 0) ||
       ((sParse.pNewTable)->pSelect == (Select *)0x0)) {
      if (sParse.pNewTrigger != (Trigger *)0x0) {
        if ((uVar7 >> 0x1a & 1) == 0) {
          puVar5 = (uchar *)0x0;
          if ((int)iVar6 == 0) {
            puVar5 = zDb;
          }
          iVar3 = renameResolveTrigger(&sParse,(char *)puVar5);
          if (iVar3 != 0) goto LAB_0016d1ca;
        }
        iVar3 = sqlite3SchemaToIndex(db,(sParse.pNewTrigger)->pTabSchema);
        iVar4 = sqlite3FindDbName(db,(char *)zDb);
        if (iVar3 == iVar4) {
          sqlite3_result_int(context,1);
        }
      }
    }
    else {
      local_68.ncFlags = 0;
      local_68._42_6_ = 0;
      local_68.pWinSelect = (Select *)0x0;
      local_68.pNext = (NameContext *)0x0;
      local_68.nRef = 0;
      local_68.nErr = 0;
      local_68.pSrcList = (SrcList *)0x0;
      local_68.uNC.pEList = (ExprList *)0x0;
      local_68.pParse = &sParse;
      sqlite3SelectPrep(&sParse,(sParse.pNewTable)->pSelect,&local_68);
      if ((sParse.nErr != 0) && (sParse.rc != 0)) goto LAB_0016d1ca;
    }
  }
  else {
LAB_0016d1ca:
    renameColumnParseError(context,1,argv[2],argv[3],&sParse);
  }
  renameParseCleanup(&sParse);
LAB_0016d1f3:
  db->xAuth = p_Var2;
  return;
}

Assistant:

static void renameTableTest(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **argv
){
  sqlite3 *db = sqlite3_context_db_handle(context);
  char const *zDb = (const char*)sqlite3_value_text(argv[0]);
  char const *zInput = (const char*)sqlite3_value_text(argv[1]);
  int bTemp = sqlite3_value_int(argv[4]);
  int isLegacy = (db->flags & SQLITE_LegacyAlter);

#ifndef SQLITE_OMIT_AUTHORIZATION
  sqlite3_xauth xAuth = db->xAuth;
  db->xAuth = 0;
#endif

  UNUSED_PARAMETER(NotUsed);
  if( zDb && zInput ){
    int rc;
    Parse sParse;
    rc = renameParseSql(&sParse, zDb, 1, db, zInput, bTemp);
    if( rc==SQLITE_OK ){
      if( isLegacy==0 && sParse.pNewTable && sParse.pNewTable->pSelect ){
        NameContext sNC;
        memset(&sNC, 0, sizeof(sNC));
        sNC.pParse = &sParse;
        sqlite3SelectPrep(&sParse, sParse.pNewTable->pSelect, &sNC);
        if( sParse.nErr ) rc = sParse.rc;
      }

      else if( sParse.pNewTrigger ){
        if( isLegacy==0 ){
          rc = renameResolveTrigger(&sParse, bTemp ? 0 : zDb);
        }
        if( rc==SQLITE_OK ){
          int i1 = sqlite3SchemaToIndex(db, sParse.pNewTrigger->pTabSchema);
          int i2 = sqlite3FindDbName(db, zDb);
          if( i1==i2 ) sqlite3_result_int(context, 1);
        }
      }
    }

    if( rc!=SQLITE_OK ){
      renameColumnParseError(context, 1, argv[2], argv[3], &sParse);
    }
    renameParseCleanup(&sParse);
  }

#ifndef SQLITE_OMIT_AUTHORIZATION
  db->xAuth = xAuth;
#endif
}